

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::TENSOR_INITIALIZING_2_Test::TestBody(TENSOR_INITIALIZING_2_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  AssertionResult gtest_ar;
  tensor<int,_2U> ts;
  array<unsigned_int,_2UL> local_a8;
  undefined4 local_a0;
  AssertHelper local_98;
  undefined4 local_90;
  allocator_type local_8b;
  allocator_type local_8a;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  tensor<int,_2U> local_40;
  
  local_a8._M_elems = (_Type)&DAT_200000001;
  local_a0 = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l,&local_89);
  local_98.data_ = (AssertHelperData *)0x500000004;
  local_90 = 6;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l_00,&local_8a);
  __l_01._M_len = 2;
  __l_01._M_array = &local_88;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_58,__l_01,&local_8b);
  dnet::data_types::tensor<int,_2U>::tensor
            (&local_40,&local_58,(array<unsigned_int,_2UL>)0x300000002);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_58);
  lVar4 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_a8._M_elems[0] = 0;
  local_a8._M_elems[1] = 0;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_40,&local_a8);
  local_98.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"(ts[{0,0}])","1",piVar3,(int *)&local_98);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_a8._M_elems + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._M_elems[0] = 0;
  local_a8._M_elems[1] = 2;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_40,&local_a8);
  local_98.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"(ts[{0,2}])","3",piVar3,(int *)&local_98);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_a8._M_elems + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._M_elems = (_Type)&DAT_100000001;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_40,&local_a8);
  local_98.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"(ts[{1,1}])","5",piVar3,(int *)&local_98);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_a8._M_elems + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_2) {
        tensor<int, 2> ts({
                                  {1,2,3},
                                  {4,5,6}
                          }, {2,3});
        EXPECT_EQ((ts[{0,0}]), 1);
        EXPECT_EQ((ts[{0,2}]), 3);
        EXPECT_EQ((ts[{1,1}]), 5);
    }